

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_utils.cpp
# Opt level: O0

void __thiscall
spvtools::opt::LoopUtils::PopulateLoopDesc
          (LoopUtils *this,Loop *new_loop,Loop *old_loop,LoopCloningResult *cloning_result)

{
  bool bVar1;
  BasicBlockListTy *this_00;
  reference pvVar2;
  BasicBlock *pBVar3;
  mapped_type *ppBVar4;
  pointer pvVar5;
  BasicBlock *local_d8;
  _Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_false> local_98;
  uint32_t local_8c;
  _Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_false> local_88;
  const_iterator it_1;
  BasicBlock *bb_1;
  _Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_false> local_68;
  const_iterator it;
  uint32_t local_58;
  uint32_t local_54;
  BasicBlock *local_50;
  BasicBlock *bb;
  _Node_iterator_base<unsigned_int,_false> _Stack_40;
  uint32_t bb_id;
  const_iterator __end2;
  const_iterator __begin2;
  BasicBlockListTy *__range2;
  LoopCloningResult *cloning_result_local;
  Loop *old_loop_local;
  Loop *new_loop_local;
  LoopUtils *this_local;
  
  this_00 = Loop::GetBlocks(old_loop);
  __end2 = std::
           unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
           ::begin(this_00);
  _Stack_40._M_cur =
       (__node_type *)
       std::
       unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
       ::end(this_00);
  while (bVar1 = std::__detail::operator!=
                           (&__end2.super__Node_iterator_base<unsigned_int,_false>,
                            &stack0xffffffffffffffc0), bVar1) {
    pvVar2 = std::__detail::_Node_const_iterator<unsigned_int,_true,_false>::operator*(&__end2);
    bb._4_4_ = *pvVar2;
    ppBVar4 = std::
              unordered_map<unsigned_int,_spvtools::opt::BasicBlock_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>_>
              ::at(&cloning_result->old_to_new_bb_,(key_type *)((long)&bb + 4));
    local_50 = *ppBVar4;
    Loop::AddBasicBlock(new_loop,local_50);
    std::__detail::_Node_const_iterator<unsigned_int,_true,_false>::operator++(&__end2);
  }
  pBVar3 = Loop::GetHeaderBlock(old_loop);
  local_54 = BasicBlock::id(pBVar3);
  ppBVar4 = std::
            unordered_map<unsigned_int,_spvtools::opt::BasicBlock_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>_>
            ::at(&cloning_result->old_to_new_bb_,&local_54);
  Loop::SetHeaderBlock(new_loop,*ppBVar4);
  pBVar3 = Loop::GetLatchBlock(old_loop);
  if (pBVar3 != (BasicBlock *)0x0) {
    pBVar3 = Loop::GetLatchBlock(old_loop);
    local_58 = BasicBlock::id(pBVar3);
    ppBVar4 = std::
              unordered_map<unsigned_int,_spvtools::opt::BasicBlock_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>_>
              ::at(&cloning_result->old_to_new_bb_,&local_58);
    Loop::SetLatchBlock(new_loop,*ppBVar4);
  }
  pBVar3 = Loop::GetContinueBlock(old_loop);
  if (pBVar3 != (BasicBlock *)0x0) {
    pBVar3 = Loop::GetContinueBlock(old_loop);
    it.super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_false>.
    _M_cur._4_4_ = BasicBlock::id(pBVar3);
    ppBVar4 = std::
              unordered_map<unsigned_int,_spvtools::opt::BasicBlock_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>_>
              ::at(&cloning_result->old_to_new_bb_,
                   (key_type *)
                   ((long)&it.
                           super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_false>
                           ._M_cur + 4));
    Loop::SetContinueBlock(new_loop,*ppBVar4);
  }
  pBVar3 = Loop::GetMergeBlock(old_loop);
  if (pBVar3 != (BasicBlock *)0x0) {
    pBVar3 = Loop::GetMergeBlock(old_loop);
    bb_1._4_4_ = BasicBlock::id(pBVar3);
    local_68._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_int,_spvtools::opt::BasicBlock_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>_>
         ::find(&cloning_result->old_to_new_bb_,(key_type *)((long)&bb_1 + 4));
    it_1 = std::
           unordered_map<unsigned_int,_spvtools::opt::BasicBlock_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>_>
           ::end(&cloning_result->old_to_new_bb_);
    bVar1 = std::__detail::operator!=
                      (&local_68,
                       &it_1.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_false>
                      );
    if (bVar1) {
      pvVar5 = std::__detail::
               _Node_const_iterator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_false,_false>
               ::operator->((_Node_const_iterator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_false,_false>
                             *)&local_68);
      local_d8 = pvVar5->second;
    }
    else {
      local_d8 = Loop::GetMergeBlock(old_loop);
    }
    Loop::SetMergeBlock(new_loop,local_d8);
  }
  pBVar3 = Loop::GetPreHeaderBlock(old_loop);
  if (pBVar3 != (BasicBlock *)0x0) {
    pBVar3 = Loop::GetPreHeaderBlock(old_loop);
    local_8c = BasicBlock::id(pBVar3);
    local_88._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_int,_spvtools::opt::BasicBlock_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>_>
         ::find(&cloning_result->old_to_new_bb_,&local_8c);
    local_98._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_int,_spvtools::opt::BasicBlock_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>_>
         ::end(&cloning_result->old_to_new_bb_);
    bVar1 = std::__detail::operator!=(&local_88,&local_98);
    if (bVar1) {
      pvVar5 = std::__detail::
               _Node_const_iterator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_false,_false>
               ::operator->((_Node_const_iterator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_false,_false>
                             *)&local_88);
      Loop::SetPreHeaderBlock(new_loop,pvVar5->second);
    }
  }
  return;
}

Assistant:

void LoopUtils::PopulateLoopDesc(
    Loop* new_loop, Loop* old_loop,
    const LoopCloningResult& cloning_result) const {
  for (uint32_t bb_id : old_loop->GetBlocks()) {
    BasicBlock* bb = cloning_result.old_to_new_bb_.at(bb_id);
    new_loop->AddBasicBlock(bb);
  }
  new_loop->SetHeaderBlock(
      cloning_result.old_to_new_bb_.at(old_loop->GetHeaderBlock()->id()));
  if (old_loop->GetLatchBlock())
    new_loop->SetLatchBlock(
        cloning_result.old_to_new_bb_.at(old_loop->GetLatchBlock()->id()));
  if (old_loop->GetContinueBlock())
    new_loop->SetContinueBlock(
        cloning_result.old_to_new_bb_.at(old_loop->GetContinueBlock()->id()));
  if (old_loop->GetMergeBlock()) {
    auto it =
        cloning_result.old_to_new_bb_.find(old_loop->GetMergeBlock()->id());
    BasicBlock* bb = it != cloning_result.old_to_new_bb_.end()
                         ? it->second
                         : old_loop->GetMergeBlock();
    new_loop->SetMergeBlock(bb);
  }
  if (old_loop->GetPreHeaderBlock()) {
    auto it =
        cloning_result.old_to_new_bb_.find(old_loop->GetPreHeaderBlock()->id());
    if (it != cloning_result.old_to_new_bb_.end()) {
      new_loop->SetPreHeaderBlock(it->second);
    }
  }
}